

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::manageTimeBlocks(CommonCore *this,ActionMessage *command)

{
  bool bVar1;
  action_t aVar2;
  reference ppVar3;
  ActionMessage *in_RSI;
  __normal_iterator<std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
  *in_RDI;
  pair<helics::GlobalFederateId,_int> *block_1;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
  *__range3;
  pair<helics::GlobalFederateId,_int> *block;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
  *__range2;
  bool found;
  CommonCore *in_stack_000001d8;
  GlobalFederateId in_stack_000001e4;
  vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
  *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
  *in_stack_ffffffffffffffa0;
  __normal_iterator<std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
  local_50;
  __normal_iterator<std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
  *local_48;
  undefined4 local_40;
  BaseType local_3c;
  reference local_38;
  pair<helics::GlobalFederateId,_int> *local_30;
  __normal_iterator<std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
  local_28;
  __normal_iterator<std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
  *local_20;
  byte local_11;
  ActionMessage *local_10;
  
  local_10 = in_RSI;
  aVar2 = ActionMessage::action(in_RSI);
  if (aVar2 == cmd_time_block) {
    local_11 = 0;
    local_20 = in_RDI + 0x126;
    local_28._M_current =
         (pair<helics::GlobalFederateId,_int> *)
         std::
         vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
         ::begin(in_stack_ffffffffffffff88);
    local_30 = (pair<helics::GlobalFederateId,_int> *)
               std::
               vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
               ::end(in_stack_ffffffffffffff88);
    while (bVar1 = __gnu_cxx::
                   operator==<std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
                             (in_RDI,(__normal_iterator<std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
                                      *)in_stack_ffffffffffffff88), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_38 = __gnu_cxx::
                 __normal_iterator<std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
                 ::operator*(&local_28);
      local_3c = (local_38->first).gid;
      bVar1 = GlobalFederateId::operator==(&local_10->source_id,(GlobalFederateId)local_3c);
      if (bVar1) {
        local_38->second = local_38->second + 1;
        local_11 = 1;
      }
      __gnu_cxx::
      __normal_iterator<std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
      ::operator++(&local_28);
    }
    if ((local_11 & 1) == 0) {
      local_40 = 1;
      std::
      vector<std::pair<helics::GlobalFederateId,int>,std::allocator<std::pair<helics::GlobalFederateId,int>>>
      ::emplace_back<helics::GlobalFederateId_const&,int>
                (in_stack_ffffffffffffffa0,
                 (GlobalFederateId *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (int *)in_RDI);
    }
  }
  else {
    aVar2 = ActionMessage::action(local_10);
    if (aVar2 == cmd_time_unblock) {
      local_48 = in_RDI + 0x126;
      local_50._M_current =
           (pair<helics::GlobalFederateId,_int> *)
           std::
           vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
           ::begin(in_stack_ffffffffffffff88);
      std::
      vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
      ::end(in_stack_ffffffffffffff88);
      while (bVar1 = __gnu_cxx::
                     operator==<std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
                               (in_RDI,(__normal_iterator<std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
                                        *)in_stack_ffffffffffffff88), ((bVar1 ^ 0xffU) & 1) != 0) {
        ppVar3 = __gnu_cxx::
                 __normal_iterator<std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
                 ::operator*(&local_50);
        bVar1 = GlobalFederateId::operator==
                          (&local_10->source_id,(GlobalFederateId)(ppVar3->first).gid);
        if ((bVar1) && (ppVar3->second = ppVar3->second + -1, ppVar3->second < 1)) {
          ppVar3->second = 0;
          transmitDelayedMessages(in_stack_000001d8,in_stack_000001e4);
        }
        __gnu_cxx::
        __normal_iterator<std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
        ::operator++(&local_50);
      }
    }
  }
  return;
}

Assistant:

void CommonCore::manageTimeBlocks(const ActionMessage& command)
{
    if (command.action() == CMD_TIME_BLOCK) {
        bool found{false};
        for (auto& block : timeBlocks) {
            if (command.source_id == block.first) {
                ++block.second;
                found = true;
            }
        }
        if (!found) {
            timeBlocks.emplace_back(command.source_id, 1);
        }
    } else if (command.action() == CMD_TIME_UNBLOCK) {
        for (auto& block : timeBlocks) {
            if (command.source_id == block.first) {
                --block.second;
                if (block.second <= 0) {
                    block.second = 0;
                    transmitDelayedMessages(command.source_id);
                }
            }
        }
    }
}